

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_TypeofPropertyScoped
              (FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
              ScriptContext *scriptContext)

{
  uint16 uVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  Var pvVar4;
  DynamicObject *obj;
  int length;
  int i;
  ScriptContext *scriptContext_local;
  Var defaultInstance_local;
  PropertyId propertyId_local;
  FrameDisplay *pScope_local;
  
  uVar1 = FrameDisplay::GetLength(pScope);
  obj._4_4_ = 0;
  while( true ) {
    if ((int)(uint)uVar1 <= (int)obj._4_4_) {
      pRVar3 = VarTo<Js::RecyclableObject>(defaultInstance);
      pvVar4 = TypeofRootFld(pRVar3,propertyId,scriptContext);
      return pvVar4;
    }
    pRVar3 = (RecyclableObject *)FrameDisplay::GetItem(pScope,obj._4_4_);
    BVar2 = HasProperty(pRVar3,propertyId);
    if (BVar2 != 0) break;
    obj._4_4_ = obj._4_4_ + 1;
  }
  pvVar4 = TypeofFld(pRVar3,propertyId,scriptContext);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::OP_TypeofPropertyScoped(FrameDisplay *pScope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofPropertyScoped);
        int i;
        int length = pScope->GetLength();

        for (i = 0; i < length; i++)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(i);
            if (JavascriptOperators::HasProperty(obj, propertyId))
            {
                return JavascriptOperators::TypeofFld(obj, propertyId, scriptContext);
            }
        }

        return JavascriptOperators::TypeofRootFld(VarTo<RecyclableObject>(defaultInstance), propertyId, scriptContext);
        JIT_HELPER_END(Op_TypeofPropertyScoped);
    }